

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

coda_type_text * coda_type_text_new(coda_format format)

{
  coda_type_text *pcVar1;
  
  pcVar1 = (coda_type_text *)malloc(0x48);
  if (pcVar1 == (coda_type_text *)0x0) {
    pcVar1 = (coda_type_text *)0x0;
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x48,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x7ad);
  }
  else {
    pcVar1->format = format;
    pcVar1->retain_count = 0;
    pcVar1->type_class = coda_text_class;
    pcVar1->read_type = coda_native_type_string;
    pcVar1->name = (char *)0x0;
    pcVar1->description = (char *)0x0;
    pcVar1->bit_size = -1;
    pcVar1->size_expr = (coda_expression *)0x0;
    pcVar1->attributes = (coda_type_record *)0x0;
    *(undefined8 *)((long)&pcVar1->attributes + 4) = 0;
    *(undefined8 *)((long)&pcVar1->fixed_value + 4) = 0;
  }
  return pcVar1;
}

Assistant:

coda_type_text *coda_type_text_new(coda_format format)
{
    coda_type_text *type;

    type = (coda_type_text *)malloc(sizeof(coda_type_text));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_type_text), __FILE__, __LINE__);
        return NULL;
    }
    type->format = format;
    type->retain_count = 0;
    type->type_class = coda_text_class;
    type->read_type = coda_native_type_string;
    type->name = NULL;
    type->description = NULL;
    type->bit_size = -1;
    type->size_expr = NULL;
    type->attributes = NULL;
    type->fixed_value = NULL;
    type->special_text_type = ascii_text_default;

    return type;
}